

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManMappingVerify(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x7f6,"void Gia_ManMappingVerify(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  if ((p->nBufs != 0) && (iVar3 = p->nObjs, 0 < iVar3)) {
    iVar9 = 0;
    lVar10 = 0;
    while (pGVar1 = p->pObjs, pGVar1 != (Gia_Obj_t *)0x0) {
      uVar5 = (uint)*(undefined8 *)(&pGVar1->field_0x0 + lVar10);
      if (((-1 < (int)uVar5) && ((uVar5 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar5 & 0x1fffffff) ==
          ((uint)((ulong)*(undefined8 *)(&pGVar1->field_0x0 + lVar10) >> 0x20) & 0x1fffffff))) {
        uVar5 = uVar5 & 0x1fffffff;
        uVar2 = *(undefined8 *)((long)pGVar1 + lVar10 + (ulong)(uVar5 * 4) * -3);
        uVar8 = (uint)uVar2;
        if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) &&
           ((((uint)((ulong)uVar2 >> 0x20) ^ uVar8) & 0x1fffffff) != 0)) {
          pGVar6 = (Gia_Obj_t *)((long)pGVar1 + lVar10 + (ulong)(uVar5 * 4) * -3);
          if ((pGVar6 < pGVar1) || (pGVar1 + iVar3 <= pGVar6)) goto LAB_00213ee6;
          uVar5 = (int)((long)(lVar10 + (ulong)(uVar5 << 2) * -3) >> 2) * -0x55555555;
          if (((int)uVar5 < 0) || (p->vMapping->nSize <= (int)uVar5)) goto LAB_00213ec7;
          if (p->vMapping->pArray[uVar5 & 0x7fffffff] == 0) {
            Abc_Print(-1,"Gia_ManMappingVerify: CO driver %d does not have mapping.\n");
          }
          else {
            Gia_ManMappingVerify_rec(p,pGVar6);
          }
        }
      }
      iVar3 = p->nObjs;
      lVar10 = lVar10 + 0xc;
      iVar9 = iVar9 + 1;
      if (iVar3 <= iVar9) break;
    }
  }
  pVVar4 = p->vCos;
  if (0 < pVVar4->nSize) {
    lVar10 = 0;
    do {
      iVar3 = pVVar4->pArray[lVar10];
      if (((long)iVar3 < 0) || (uVar5 = p->nObjs, (int)uVar5 <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar6 = pGVar1 + iVar3;
      uVar7 = (ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff);
      uVar8 = (uint)*(undefined8 *)(pGVar6 + -uVar7);
      if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) &&
         ((((uint)((ulong)*(undefined8 *)(pGVar6 + -uVar7) >> 0x20) ^ uVar8) & 0x1fffffff) != 0)) {
        pGVar6 = pGVar6 + -uVar7;
        if ((pGVar6 < pGVar1) || (pGVar1 + uVar5 <= pGVar6)) {
LAB_00213ee6:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar5 = (int)((long)pGVar6 - (long)pGVar1 >> 2) * -0x55555555;
        if (((int)uVar5 < 0) || (p->vMapping->nSize <= (int)uVar5)) {
LAB_00213ec7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p->vMapping->pArray[uVar5 & 0x7fffffff] == 0) {
          Abc_Print(-1,"Gia_ManMappingVerify: CO driver %d does not have mapping.\n");
        }
        else {
          Gia_ManMappingVerify_rec(p,pGVar6);
        }
      }
      lVar10 = lVar10 + 1;
      pVVar4 = p->vCos;
    } while (lVar10 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Gia_ManMappingVerify( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, Result = 1;
    assert( Gia_ManHasMapping(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachBuf( p, pObj, i )
    {
        pFanin = Gia_ObjFanin0(pObj);
        if ( !Gia_ObjIsAndNotBuf(pFanin) )
            continue;
        if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pFanin)) )
        {
            Abc_Print( -1, "Gia_ManMappingVerify: CO driver %d does not have mapping.\n", Gia_ObjId(p, pFanin) );
            Result = 0;
            continue;
        }
        Result &= Gia_ManMappingVerify_rec( p, pFanin );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        pFanin = Gia_ObjFanin0(pObj);
        if ( !Gia_ObjIsAndNotBuf(pFanin) )
            continue;
        if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pFanin)) )
        {
            Abc_Print( -1, "Gia_ManMappingVerify: CO driver %d does not have mapping.\n", Gia_ObjId(p, pFanin) );
            Result = 0;
            continue;
        }
        Result &= Gia_ManMappingVerify_rec( p, pFanin );
    }
//    if ( Result && Gia_NtkIsRoot(p) )
//        Abc_Print( 1, "Mapping verified correctly.\n" );
}